

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O3

REF_STATUS ref_import_tetgen_node(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_CELL ref_cell;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  long lVar6;
  FILE *pFVar7;
  undefined8 uVar8;
  char *pcVar9;
  size_t __n;
  uint uVar10;
  ulong global;
  REF_INT item;
  REF_INT mark;
  REF_INT nnode;
  REF_INT id;
  REF_INT ntri;
  REF_INT new_node;
  REF_INT attr;
  REF_INT ndim;
  REF_DBL xyz [3];
  REF_INT new_cell;
  REF_INT nodes [27];
  char project [1000];
  char othername [1024];
  uint local_8d8;
  int local_8d4;
  int local_8d0;
  undefined4 local_8cc;
  int local_8c8;
  uint local_8c4;
  int local_8c0;
  int local_8bc;
  REF_DBL local_8b8;
  REF_DBL local_8b0;
  REF_DBL local_8a8;
  REF_INT local_89c;
  uint local_898;
  uint local_894;
  uint local_890;
  undefined4 local_88c;
  undefined1 local_828 [1008];
  char local_438 [1032];
  
  sVar5 = strlen(filename);
  __n = 0x3fa;
  if (sVar5 < 0x400) {
    __n = sVar5 - 5;
  }
  iVar3 = strncmp(filename + __n,".node",5);
  if (iVar3 == 0) {
    memcpy(local_828,filename,__n);
    local_828[__n] = 0;
    uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
    if (uVar4 != 0) {
      pcVar9 = "create grid";
      uVar8 = 0x4cb;
LAB_0015d7c8:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             uVar8,"ref_import_tetgen_node",(ulong)uVar4,pcVar9);
      return uVar4;
    }
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    pFVar7 = fopen(filename,"r");
    if (pFVar7 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      uVar8 = 0x4d1;
LAB_0015d8df:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             uVar8,"ref_import_tetgen_node","unable to open file");
      return 2;
    }
    iVar3 = __isoc99_fscanf(pFVar7,"%d",&local_8d0);
    if (iVar3 != 1) {
      lVar6 = (long)iVar3;
      pcVar9 = "node header nnode";
      global = 1;
      uVar8 = 0x4d3;
      goto LAB_0015d76c;
    }
    iVar3 = __isoc99_fscanf(pFVar7,"%d",&local_8bc);
    if (iVar3 != 1) {
      lVar6 = (long)iVar3;
      pcVar9 = "node header ndim";
      global = 1;
      uVar8 = 0x4d4;
      goto LAB_0015d76c;
    }
    lVar6 = (long)local_8bc;
    if (lVar6 != 3) {
      pcVar9 = "not 3D";
      global = 3;
      uVar8 = 0x4d5;
      goto LAB_0015d76c;
    }
    iVar3 = __isoc99_fscanf(pFVar7,"%d",&local_8c0);
    if (iVar3 != 1) {
      lVar6 = (long)iVar3;
      pcVar9 = "node header attr";
      global = 1;
      uVar8 = 0x4d6;
      goto LAB_0015d76c;
    }
    lVar6 = (long)local_8c0;
    if (lVar6 == 0) {
      iVar3 = __isoc99_fscanf(pFVar7,"%d",&local_8d4);
      if (iVar3 != 1) {
        lVar6 = (long)iVar3;
        pcVar9 = "node header mark";
        global = 1;
        uVar8 = 0x4d8;
        goto LAB_0015d76c;
      }
      lVar6 = (long)local_8d4;
      if (lVar6 == 0) {
        if (0 < local_8d0) {
          global = 0;
          do {
            iVar3 = __isoc99_fscanf(pFVar7,"%d",&local_8d8);
            if (iVar3 != 1) {
              lVar6 = (long)iVar3;
              pcVar9 = "node item";
              global = 1;
              uVar8 = 0x4dc;
              goto LAB_0015d76c;
            }
            if (global != local_8d8) {
              lVar6 = (long)(int)local_8d8;
              pcVar9 = "file node index";
              uVar8 = 0x4dd;
              goto LAB_0015d76c;
            }
            uVar4 = ref_node_add(ref_node,global,(REF_INT *)&local_8c4);
            if (uVar4 != 0) {
              pcVar9 = "add node";
              uVar8 = 0x4de;
              goto LAB_0015d7c8;
            }
            if (global != local_8c4) {
              pcVar9 = "node index";
              uVar8 = 0x4df;
LAB_0015ddfe:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,uVar8,"ref_import_tetgen_node",pcVar9);
              return 1;
            }
            iVar3 = __isoc99_fscanf(pFVar7,"%lf",&local_8b8);
            if (iVar3 != 1) {
              pcVar9 = "x";
              uVar8 = 0x4e0;
              goto LAB_0015ddfe;
            }
            iVar3 = __isoc99_fscanf(pFVar7,"%lf",&local_8b0);
            if (iVar3 != 1) {
              pcVar9 = "y";
              uVar8 = 0x4e1;
              goto LAB_0015ddfe;
            }
            iVar3 = __isoc99_fscanf(pFVar7,"%lf",&local_8a8);
            if (iVar3 != 1) {
              pcVar9 = "z";
              uVar8 = 0x4e2;
              goto LAB_0015ddfe;
            }
            pRVar2 = ref_node->real;
            lVar6 = (long)(int)local_8c4;
            pRVar2[lVar6 * 0xf] = local_8b8;
            pRVar2[lVar6 * 0xf + 1] = local_8b0;
            pRVar2[lVar6 * 0xf + 2] = local_8a8;
            global = global + 1;
          } while ((long)global < (long)local_8d0);
        }
        fclose(pFVar7);
        uVar4 = ref_node_initialize_n_global(ref_node,(long)local_8d0);
        if (uVar4 != 0) {
          pcVar9 = "init glob";
          uVar8 = 0x4e9;
          goto LAB_0015d7c8;
        }
        snprintf(local_438,0x3fb,"%s.face",local_828);
        pFVar7 = fopen(local_438,"r");
        if (pFVar7 == (FILE *)0x0) {
          printf("unable to open %s\n",local_438);
          uVar8 = 0x4ee;
          goto LAB_0015d8df;
        }
        iVar3 = __isoc99_fscanf(pFVar7,"%d",&local_8c8);
        if (iVar3 == 1) {
          iVar3 = __isoc99_fscanf(pFVar7,"%d",&local_8d4);
          if (iVar3 == 1) {
            if (0 < local_8c8) {
              ref_cell = pRVar1->cell[3];
              uVar10 = 0;
              do {
                iVar3 = __isoc99_fscanf(pFVar7,"%d",&local_8d8);
                if (iVar3 != 1) {
                  lVar6 = (long)iVar3;
                  pcVar9 = "read tri item";
                  global = 1;
                  uVar8 = 0x4f4;
                  goto LAB_0015d76c;
                }
                lVar6 = (long)(int)local_8d8;
                if (uVar10 != local_8d8) {
                  global = (ulong)uVar10;
                  pcVar9 = "tri index";
                  uVar8 = 0x4f5;
                  goto LAB_0015d76c;
                }
                lVar6 = 0;
                do {
                  iVar3 = __isoc99_fscanf(pFVar7,"%d",(long)&local_898 + lVar6);
                  if (iVar3 != 1) {
                    pcVar9 = "tri";
                    uVar8 = 0x4f7;
                    goto LAB_0015ddfe;
                  }
                  lVar6 = lVar6 + 4;
                } while (lVar6 != 0xc);
                local_8cc = 0;
                if ((local_8d4 == 1) &&
                   (iVar3 = __isoc99_fscanf(pFVar7,"%d",&local_8cc), iVar3 != 1)) {
                  lVar6 = (long)iVar3;
                  pcVar9 = "tri mark id";
                  global = 1;
                  uVar8 = 0x4f9;
                  goto LAB_0015d76c;
                }
                local_88c = local_8cc;
                printf("cell %d: %d %d %d %d\n",(ulong)uVar10,(ulong)local_898,(ulong)local_894,
                       (ulong)local_890);
                uVar4 = ref_cell_add(ref_cell,(REF_INT *)&local_898,&local_89c);
                if (uVar4 != 0) {
                  pcVar9 = "tri face for tri";
                  uVar8 = 0x4fd;
                  goto LAB_0015d7c8;
                }
                uVar10 = uVar10 + 1;
              } while ((int)uVar10 < local_8c8);
            }
            fclose(pFVar7);
            return 0;
          }
          lVar6 = (long)iVar3;
          pcVar9 = "face header mark";
          global = 1;
          uVar8 = 0x4f0;
        }
        else {
          lVar6 = (long)iVar3;
          pcVar9 = "face header ntri";
          global = 1;
          uVar8 = 0x4ef;
        }
        goto LAB_0015d76c;
      }
      pcVar9 = "nodes have mark";
      uVar8 = 0x4d9;
    }
    else {
      pcVar9 = "nodes have attribute 3D";
      uVar8 = 0x4d7;
    }
  }
  else {
    lVar6 = (long)iVar3;
    pcVar9 = "filename does not end in .node";
    uVar8 = 0x4c5;
  }
  global = 0;
LAB_0015d76c:
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar8,
         "ref_import_tetgen_node",pcVar9,global,lVar6);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_import_tetgen_node(REF_GRID *ref_grid_ptr,
                                                 REF_MPI ref_mpi,
                                                 const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  FILE *file;
  char project[1000], othername[1024];
  REF_INT nnode, ndim, attr, mark, node, item, new_node;
  REF_INT ntri, new_cell, cell, id, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL xyz[3];
  size_t end_of_string;
  end_of_string = MIN(1023, strlen(filename));

  REIS(0, strncmp(&filename[end_of_string - 5], ".node", 5),
       "filename does not end in .node");

  RAS(end_of_string < 1024, "filename too long for temp string");
  memcpy(project, filename, end_of_string - 5);
  project[end_of_string - 5] = '\0';

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  REIS(1, fscanf(file, "%d", &nnode), "node header nnode");
  REIS(1, fscanf(file, "%d", &ndim), "node header ndim");
  REIS(3, ndim, "not 3D");
  REIS(1, fscanf(file, "%d", &attr), "node header attr");
  REIS(0, attr, "nodes have attribute 3D");
  REIS(1, fscanf(file, "%d", &mark), "node header mark");
  REIS(0, mark, "nodes have mark");

  for (node = 0; node < nnode; node++) {
    REIS(1, fscanf(file, "%d", &item), "node item");
    REIS(node, item, "file node index");
    RSS(ref_node_add(ref_node, node, &new_node), "add node");
    RES(node, new_node, "node index");
    RES(1, fscanf(file, "%lf", &(xyz[0])), "x");
    RES(1, fscanf(file, "%lf", &(xyz[1])), "y");
    RES(1, fscanf(file, "%lf", &(xyz[2])), "z");
    ref_node_xyz(ref_node, 0, new_node) = xyz[0];
    ref_node_xyz(ref_node, 1, new_node) = xyz[1];
    ref_node_xyz(ref_node, 2, new_node) = xyz[2];
  }
  fclose(file);

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");

  snprintf(othername, 1019, "%s.face", project);
  file = fopen(othername, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", othername);
  RNS(file, "unable to open file");
  REIS(1, fscanf(file, "%d", &ntri), "face header ntri");
  REIS(1, fscanf(file, "%d", &mark), "face header mark");

  ref_cell = ref_grid_tri(ref_grid);
  for (cell = 0; cell < ntri; cell++) {
    REIS(1, fscanf(file, "%d", &item), "read tri item");
    REIS(cell, item, "tri index");
    for (node = 0; node < 3; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tri");
    id = 0;
    if (1 == mark) REIS(1, fscanf(file, "%d", &id), "tri mark id");
    nodes[3] = id;
    printf("cell %d: %d %d %d %d\n", cell, nodes[0], nodes[1], nodes[2],
           nodes[3]);
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "tri face for tri");
  }

  fclose(file);

  return REF_SUCCESS;
}